

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,initializer_list<double> *coefficients)

{
  complex<double> local_48;
  double local_38;
  double c;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<double> *__range2;
  initializer_list<double> *coefficients_local;
  Polynomial<double> *this_local;
  
  __range2 = coefficients;
  coefficients_local = (initializer_list<double> *)this;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->coefficients_);
  __begin0 = (const_iterator)__range2;
  __end0 = std::initializer_list<double>::begin(__range2);
  c = (double)std::initializer_list<double>::end((initializer_list<double> *)__begin0);
  for (; __end0 != (const_iterator)c; __end0 = __end0 + 1) {
    local_38 = *__end0;
    std::complex<double>::complex(&local_48,local_38,0.0);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (&this->coefficients_,&local_48);
  }
  removeHighOrderZeroCoefficients(this);
  updateOrderAndSize(this);
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::initializer_list<T>& coefficients) {

            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }